

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::CordFieldGenerator::
GenerateSerializeWithCachedSizesToArray(CordFieldGenerator *this,Printer *printer)

{
  cpp *this_00;
  Options *field;
  Arg *in_R8;
  string_view format_00;
  string_view parameters;
  _Alloc_hider in_stack_ffffffffffffff68;
  bool local_90;
  Formatter format;
  undefined1 local_50 [3] [16];
  
  format.printer_ = printer;
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&format.vars_,
                 (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&(this->super_FieldGeneratorBase).variables_);
  this_00 = (cpp *)(this->super_FieldGeneratorBase).field_;
  if (this_00[2] == (cpp)0x9) {
    field = (this->super_FieldGeneratorBase).options_;
    local_50[0] = google::protobuf::io::Printer::LookupVar(printer,4,"name");
    format_00._M_str = (char *)local_50;
    format_00._M_len = (size_t)"this_._internal_$0(), ";
    absl::lts_20240722::Substitute_abi_cxx11_
              ((string *)&stack0xffffffffffffff68,(lts_20240722 *)0x16,format_00,in_R8);
    parameters._M_str = (char *)&format;
    parameters._M_len = (size_t)in_stack_ffffffffffffff68._M_p;
    GenerateUtf8CheckCodeForCord
              (this_00,(FieldDescriptor *)field,(Options *)0x0,local_90,parameters,
               (Formatter *)in_stack_ffffffffffffff68._M_p);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  }
  Formatter::operator()<>
            (&format,
             "target = stream->Write$declared_type$($number$, this_._internal_$name$(), target);\n")
  ;
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&format.vars_);
  return;
}

Assistant:

void CordFieldGenerator::GenerateSerializeWithCachedSizesToArray(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  if (field_->type() == FieldDescriptor::TYPE_STRING) {
    GenerateUtf8CheckCodeForCord(
        field_, options_, false,
        absl::Substitute("this_._internal_$0(), ", printer->LookupVar("name")),
        format);
  }
  format(
      "target = stream->Write$declared_type$($number$, "
      "this_._internal_$name$(), "
      "target);\n");
}